

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crange.cpp
# Opt level: O2

short CRange::init_switch(string *switchfile)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  dictionary *d;
  ushort uVar5;
  
  uVar5 = 0x28;
  if (switchfile->_M_string_length != 0) {
    iVar2 = access((switchfile->_M_dataplus)._M_p,4);
    if (iVar2 == 0) {
      d = iniparser_load((switchfile->_M_dataplus)._M_p);
      iVar2 = iniparser_getboolean(d,"switch:barkas",0);
      iVar3 = iniparser_getboolean(d,"switch:shell",0);
      uVar5 = (iVar2 != 0) + 2;
      if (iVar3 == 0) {
        uVar5 = (ushort)(iVar2 != 0);
      }
      iVar2 = iniparser_getboolean(d,"switch:leung",0);
      uVar1 = uVar5 + 4;
      if (iVar2 == 0) {
        uVar1 = uVar5;
      }
      iVar2 = iniparser_getboolean(d,"switch:new delta",1);
      uVar5 = uVar1 + 8;
      if (iVar2 == 0) {
        uVar5 = uVar1;
      }
      iVar2 = iniparser_getboolean(d,"switch:new electron capture",0);
      uVar1 = uVar5 | 0x10;
      if (iVar2 == 0) {
        uVar1 = uVar5;
      }
      iVar2 = iniparser_getboolean(d,"switch:finite nuclear size",1);
      uVar5 = uVar1 | 0x20;
      if (iVar2 == 0) {
        uVar5 = uVar1;
      }
      iVar2 = iniparser_getboolean(d,"switch:kinematic",0);
      uVar1 = uVar5 | 0x40;
      if (iVar2 == 0) {
        uVar1 = uVar5;
      }
      iVar2 = iniparser_getboolean(d,"switch:radiative",0);
      uVar5 = uVar1 | 0x80;
      if (iVar2 == 0) {
        uVar5 = uVar1;
      }
      iVar2 = iniparser_getboolean(d,"switch:pair",0);
      uVar1 = uVar5 | 0x100;
      if (iVar2 == 0) {
        uVar1 = uVar5;
      }
      iVar2 = iniparser_getboolean(d,"switch:bremsstrahlung",0);
      uVar5 = uVar1 | 0x200;
      if (iVar2 == 0) {
        uVar5 = uVar1;
      }
      iniparser_freedict(d);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Could not read switch file: ");
      poVar4 = std::operator<<(poVar4,(string *)switchfile);
      poVar4 = std::operator<<(poVar4,". Using default crange switches.");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  return uVar5;
}

Assistant:

short CRange::init_switch( const std::string &switchfile )
{
    short sswitch = SSWITCH_DEFAULT;
    if (switchfile.length() == 0) return sswitch;
    if (access(switchfile.c_str(), R_OK) == 0) {
        sswitch = 0;
        dictionary *d = iniparser_load( switchfile.c_str() );
        if (iniparser_getboolean(d,"switch:barkas",0)) sswitch |= SSWITCH_BA;
        if (iniparser_getboolean(d,"switch:shell",0))  sswitch |= SSWITCH_SH;
        if (iniparser_getboolean(d,"switch:leung",0))  sswitch |= SSWITCH_LE;
        if (iniparser_getboolean(d,"switch:new delta",1))  sswitch |= SSWITCH_ND; // True by default!
        if (iniparser_getboolean(d,"switch:new electron capture",0))  sswitch |= SSWITCH_EC;
        if (iniparser_getboolean(d,"switch:finite nuclear size",1))  sswitch |= SSWITCH_NS; // True by default!
        if (iniparser_getboolean(d,"switch:kinematic",0))  sswitch |= SSWITCH_KI;
        if (iniparser_getboolean(d,"switch:radiative",0))  sswitch |= SSWITCH_RA;
        if (iniparser_getboolean(d,"switch:pair",0))  sswitch |= SSWITCH_PA;
        if (iniparser_getboolean(d,"switch:bremsstrahlung",0))  sswitch |= SSWITCH_BR;
        iniparser_freedict(d);
    } else {
        std::cerr << "Could not read switch file: " << switchfile
                  << ". Using default crange switches." << std::endl;
    }
    return sswitch;
}